

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_writeEpilogue(ZSTD_CCtx *cctx,void *dst,size_t dstCapacity)

{
  ZSTD_CCtx_params params;
  uint uVar1;
  ulong in_RDX;
  long in_RSI;
  int *in_RDI;
  undefined1 in_stack_00000000 [56];
  U32 checksum;
  U32 cBlockHeader24;
  size_t fhSize;
  BYTE *op;
  BYTE *ostart;
  undefined8 in_stack_ffffffffffffff38;
  U32 val32;
  void *in_stack_ffffffffffffff40;
  XXH64_state_t *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  long lVar2;
  undefined8 in_stack_fffffffffffffff8;
  size_t sVar3;
  
  val32 = (U32)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  if (*in_RDI == 0) {
    sVar3 = 0xffffffffffffffc4;
  }
  else {
    lVar2 = in_RSI;
    if (*in_RDI == 1) {
      val32 = (U32)((ulong)*(undefined8 *)(in_RDI + 0x22) >> 0x20);
      in_stack_ffffffffffffff40 = *(void **)(in_RDI + 0x24);
      in_stack_ffffffffffffff68 = *(XXH64_state_t **)(in_RDI + 0x2e);
      params.cParams.windowLog = in_stack_ffffffffffffffc4;
      params.format = in_stack_ffffffffffffffc0;
      params.cParams.chainLog = 0;
      params.cParams.hashLog = 0;
      params.cParams._12_8_ = in_RSI;
      params.cParams._20_8_ = in_RSI;
      params.fParams._0_8_ = in_RDX;
      params._40_8_ = in_RSI;
      params._48_8_ = in_RDI;
      params._56_8_ = in_stack_fffffffffffffff8;
      params._64_56_ = in_stack_00000000;
      sVar3 = ZSTD_writeFrameHeader
                        (*(void **)(in_RDI + 0x3e),*(size_t *)(in_RDI + 0x3c),params,
                         *(U64 *)(in_RDI + 0x3a),
                         (U32)((ulong)*(undefined8 *)(in_RDI + 0x38) >> 0x20));
      uVar1 = ZSTD_isError(0x28b819);
      if (uVar1 != 0) {
        return sVar3;
      }
      in_RDX = in_RDX - sVar3;
      in_RSI = sVar3 + in_RSI;
      *in_RDI = 2;
    }
    if (*in_RDI != 3) {
      if (in_RDX < 4) {
        return 0xffffffffffffffba;
      }
      MEM_writeLE32(in_stack_ffffffffffffff40,val32);
      in_RSI = in_RSI + 3;
      in_RDX = in_RDX - 3;
    }
    if (in_RDI[0x2b] != 0) {
      XXH64_digest(in_stack_ffffffffffffff68);
      if (in_RDX < 4) {
        return 0xffffffffffffffba;
      }
      MEM_writeLE32(in_stack_ffffffffffffff40,val32);
      in_RSI = in_RSI + 4;
    }
    *in_RDI = 0;
    sVar3 = in_RSI - lVar2;
  }
  return sVar3;
}

Assistant:

static size_t ZSTD_writeEpilogue(ZSTD_CCtx* cctx, void* dst, size_t dstCapacity)
{
    BYTE* const ostart = (BYTE*)dst;
    BYTE* op = ostart;
    size_t fhSize = 0;

    DEBUGLOG(4, "ZSTD_writeEpilogue");
    if (cctx->stage == ZSTDcs_created) return ERROR(stage_wrong);  /* init missing */

    /* special case : empty frame */
    if (cctx->stage == ZSTDcs_init) {
        fhSize = ZSTD_writeFrameHeader(dst, dstCapacity, cctx->appliedParams, 0, 0);
        if (ZSTD_isError(fhSize)) return fhSize;
        dstCapacity -= fhSize;
        op += fhSize;
        cctx->stage = ZSTDcs_ongoing;
    }

    if (cctx->stage != ZSTDcs_ending) {
        /* write one last empty block, make it the "last" block */
        U32 const cBlockHeader24 = 1 /* last block */ + (((U32)bt_raw)<<1) + 0;
        if (dstCapacity<4) return ERROR(dstSize_tooSmall);
        MEM_writeLE32(op, cBlockHeader24);
        op += ZSTD_blockHeaderSize;
        dstCapacity -= ZSTD_blockHeaderSize;
    }

    if (cctx->appliedParams.fParams.checksumFlag) {
        U32 const checksum = (U32) XXH64_digest(&cctx->xxhState);
        if (dstCapacity<4) return ERROR(dstSize_tooSmall);
        DEBUGLOG(4, "ZSTD_writeEpilogue: write checksum : %08X", checksum);
        MEM_writeLE32(op, checksum);
        op += 4;
    }

    cctx->stage = ZSTDcs_created;  /* return to "created but no init" status */
    return op-ostart;
}